

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int __thiscall ON_Mesh::CullUnusedVertices(ON_Mesh *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  DeleteComponents(this,(ON_COMPONENT_INDEX *)0x0,0,true,false,true,false);
  iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (iVar2 == 0) {
    Destroy(this);
    iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  return iVar1 - iVar2;
}

Assistant:

int ON_Mesh::CullUnusedVertices()
{
  const unsigned int vcount0 = m_V.UnsignedCount();

  DeleteComponents(
    nullptr, // ci_list
    0,       // ci_count
    true,    // bIgnoreInvalidComponents
    false,   // bRemoveDegenerateFaces
    true,    // bRemoveUnusedVertices
    false    // bRemoveEmptyNgons
    );

  if ( 0 == m_V.UnsignedCount() )
    Destroy();

  return ((int)(vcount0 - m_V.UnsignedCount()));
}